

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     DefaultPrintTo<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
               (undefined8 param_1,undefined8 *param_2,ostream *param_3)

{
  long lVar1;
  Subject *pSVar2;
  
  std::operator<<(param_3,'{');
  pSVar2 = (Subject *)*param_2;
  lVar1 = 0;
  do {
    if (pSVar2 == (Subject *)param_2[1]) {
      if (lVar1 != 0) {
LAB_001acea7:
        std::operator<<(param_3,' ');
      }
      std::operator<<(param_3,'}');
      return;
    }
    if ((lVar1 != 0) && (std::operator<<(param_3,','), lVar1 == 0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_001acea7;
    }
    std::operator<<(param_3,' ');
    bidfx_public_api::price::subject::operator<<(param_3,pSVar2);
    pSVar2 = pSVar2 + 0x18;
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

void DefaultPrintTo(IsContainer /* dummy */,
                    false_type /* is not a pointer */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}